

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::RawBufferAsyncModifyComplete_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  int iVar1;
  int iVar2;
  ScriptContext *pSVar3;
  Var aValue;
  ArrayBuffer *pAVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 auStack_48 [8];
  TTDPendingAsyncBufferModification pendingAsyncInfo;
  
  pSVar3 = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (pSVar3 == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == RawBufferAsyncModifyComplete) {
    aValue = InflateVarInReplay(executeContext,*(TTDVar *)(evt + 1));
    pAVar4 = Js::VarTo<Js::ArrayBuffer>(aValue);
    iVar1 = (*(pAVar4->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pAVar4);
    pendingAsyncInfo._8_8_ = ZEXT48(evt[2].EventKind);
    iVar2 = (*(pAVar4->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pAVar4);
    auStack_48 = (undefined1  [8])0x0;
    pendingAsyncInfo.ArrayBufferVar = (Var)0x0;
    ScriptContextTTD::GetFromAsyncPendingList
              (pSVar3->TTDContextInfo,(TTDPendingAsyncBufferModification *)auStack_48,
               (byte *)((ulong)(uint)evt[2].ResultStatus + (ulong)evt[2].EventKind +
                       CONCAT44(extraout_var_00,iVar2)));
    if (((undefined1  [8])pAVar4 == auStack_48) &&
       (evt[2].EventKind == (EventKind)pendingAsyncInfo.ArrayBufferVar)) {
      js_memcpy_s((void *)(CONCAT44(extraout_var,iVar1) + pendingAsyncInfo._8_8_),
                  (ulong)(uint)evt[2].ResultStatus,(void *)evt[1].EventTimeStamp,
                  (ulong)(uint)evt[2].ResultStatus);
      return;
    }
    TTDAbort_unrecoverable_error("Something is not right.");
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void RawBufferAsyncModifyComplete_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTRawBufferModifyAction* action = GetInlineEventDataAs<JsRTRawBufferModifyAction, EventKind::RawBufferAsyncModifyComplete>(evt);
            Js::Var trgt = InflateVarInReplay(executeContext, action->Trgt); //never cross context

            const Js::ArrayBuffer* dstBuff = Js::VarTo<Js::ArrayBuffer>(trgt);
            byte* copyBuff = dstBuff->GetBuffer() + action->Index;
            byte* finalModPos = dstBuff->GetBuffer() + action->Index + action->Length;

            TTDPendingAsyncBufferModification pendingAsyncInfo = { 0 };
            ctx->TTDContextInfo->GetFromAsyncPendingList(&pendingAsyncInfo, finalModPos);
            TTDAssert(dstBuff == pendingAsyncInfo.ArrayBufferVar && action->Index == pendingAsyncInfo.Index, "Something is not right.");

            js_memcpy_s(copyBuff, action->Length, action->Data, action->Length);
        }